

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O2

void Vec_BitSetEntry(Vec_Bit_t *p,int i,int Entry)

{
  uint uVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  size_t __size;
  long lVar7;
  int iVar8;
  
  uVar1 = p->nSize;
  if ((int)uVar1 <= i) {
    uVar6 = i + 1;
    iVar8 = p->nCap;
    uVar4 = uVar6;
    if (((iVar8 * 2 <= i) || (uVar4 = iVar8 * 2, iVar8 <= i)) && (iVar8 < (int)uVar4)) {
      iVar8 = (((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0);
      __size = (long)iVar8 << 2;
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc(__size);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,__size);
      }
      p->pArray = piVar2;
      if (piVar2 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
      }
      p->nCap = iVar8 * 0x20;
      uVar1 = p->nSize;
    }
    if (i < (int)uVar1) {
      __assert_fail("p->nSize < nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x19a,"void Vec_BitFillExtra(Vec_Bit_t *, int, int)");
    }
    uVar4 = (int)uVar1 >> 5;
    uVar5 = (ulong)uVar4;
    bVar3 = (byte)uVar6;
    if (uVar4 == (int)uVar6 >> 5) {
      p->pArray[(int)uVar4] =
           p->pArray[(int)uVar4] & ~(~(-1 << (bVar3 - (byte)uVar1 & 0x1f)) << ((byte)uVar1 & 0x1f));
    }
    else {
      piVar2 = p->pArray;
      uVar5 = (ulong)(int)uVar4;
      piVar2[uVar5] =
           piVar2[uVar5] & (-(uint)((uVar1 & 0x1f) == 0) | ~(-1 << (sbyte)(uVar1 & 0x1f)));
      lVar7 = (long)((int)uVar6 >> 5);
      piVar2[lVar7] = ((uint)piVar2[lVar7] >> (bVar3 & 0x1f)) << (bVar3 & 0x1f);
      while (uVar5 = uVar5 + 1, (long)uVar5 < lVar7) {
        piVar2[uVar5] = 0;
      }
    }
    Entry = (int)uVar5;
    p->nSize = uVar6;
  }
  Vec_BitWriteEntry(p,i,Entry);
  return;
}

Assistant:

static inline void Vec_BitSetEntry( Vec_Bit_t * p, int i, int Entry )
{
    Vec_BitFillExtra( p, i + 1, 0 );
    Vec_BitWriteEntry( p, i, Entry );
}